

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O3

void Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ReserveResourceLayout
               (PipelineResourceLayoutDesc *SrcLayout,FixedLinearAllocator *MemPool)

{
  Char *pCVar1;
  ulong uVar2;
  long lVar3;
  string msg;
  string local_50;
  
  if (SrcLayout->Variables != (ShaderResourceVariableDesc *)0x0) {
    FixedLinearAllocator::AddSpace(MemPool,(ulong)SrcLayout->NumVariables << 4,8);
    if (SrcLayout->NumVariables != 0) {
      lVar3 = 0;
      uVar2 = 0;
      do {
        pCVar1 = *(Char **)((long)&SrcLayout->Variables->Name + lVar3);
        if (pCVar1 == (Char *)0x0) {
          FormatString<char[28]>(&local_50,(char (*) [28])"Variable name can\'t be null");
          DebugAssertionFailed
                    (local_50._M_dataplus._M_p,"ReserveResourceLayout",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                     ,0x49b);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          pCVar1 = *(Char **)((long)&SrcLayout->Variables->Name + lVar3);
        }
        FixedLinearAllocator::AddSpaceForString(MemPool,pCVar1,0);
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x10;
      } while (uVar2 < SrcLayout->NumVariables);
    }
  }
  if (SrcLayout->ImmutableSamplers != (ImmutableSamplerDesc *)0x0) {
    lVar3 = 8;
    FixedLinearAllocator::AddSpace(MemPool,(ulong)SrcLayout->NumImmutableSamplers * 0x48,8);
    if (SrcLayout->NumImmutableSamplers != 0) {
      uVar2 = 0;
      do {
        pCVar1 = *(Char **)((long)(SrcLayout->ImmutableSamplers->Desc).BorderColor + lVar3 + -0x2c);
        if (pCVar1 == (Char *)0x0) {
          FormatString<char[48]>
                    (&local_50,(char (*) [48])"Immutable sampler or texture name can\'t be null");
          DebugAssertionFailed
                    (local_50._M_dataplus._M_p,"ReserveResourceLayout",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                     ,0x4a5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          pCVar1 = *(Char **)((long)(SrcLayout->ImmutableSamplers->Desc).BorderColor + lVar3 + -0x2c
                             );
        }
        FixedLinearAllocator::AddSpaceForString(MemPool,pCVar1,0);
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x48;
      } while (uVar2 < SrcLayout->NumImmutableSamplers);
    }
  }
  return;
}

Assistant:

static void ReserveResourceLayout(const PipelineResourceLayoutDesc& SrcLayout, FixedLinearAllocator& MemPool) noexcept
    {
        if (SrcLayout.Variables != nullptr)
        {
            MemPool.AddSpace<ShaderResourceVariableDesc>(SrcLayout.NumVariables);
            for (Uint32 i = 0; i < SrcLayout.NumVariables; ++i)
            {
                VERIFY(SrcLayout.Variables[i].Name != nullptr, "Variable name can't be null");
                MemPool.AddSpaceForString(SrcLayout.Variables[i].Name);
            }
        }

        if (SrcLayout.ImmutableSamplers != nullptr)
        {
            MemPool.AddSpace<ImmutableSamplerDesc>(SrcLayout.NumImmutableSamplers);
            for (Uint32 i = 0; i < SrcLayout.NumImmutableSamplers; ++i)
            {
                VERIFY(SrcLayout.ImmutableSamplers[i].SamplerOrTextureName != nullptr, "Immutable sampler or texture name can't be null");
                MemPool.AddSpaceForString(SrcLayout.ImmutableSamplers[i].SamplerOrTextureName);
            }
        }

        static_assert(std::is_trivially_destructible<decltype(*SrcLayout.Variables)>::value, "Add destructor for this object to Destruct()");
        static_assert(std::is_trivially_destructible<decltype(*SrcLayout.ImmutableSamplers)>::value, "Add destructor for this object to Destruct()");
    }